

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transform.cpp
# Opt level: O3

Transform * pbrt::Orthographic(Transform *__return_storage_ptr__,Float zNear,Float zFar)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 in_register_00001204 [12];
  undefined1 auVar3 [16];
  Transform local_108;
  Transform local_88;
  
  local_88.m.m[0][0] = 1.0;
  local_88.m.m[0][1] = 0.0;
  local_88.m.m[0][2] = 0.0;
  local_88.m.m[0][3] = 0.0;
  local_88.m.m[1][0] = 0.0;
  local_88.m.m[1][1] = 1.0;
  local_88.m.m[1][2] = 0.0;
  local_88.m.m[1][3] = 0.0;
  local_88.m.m[2][0] = 0.0;
  local_88.m.m[2][1] = 0.0;
  local_108.m.m[0][0] = 1.0;
  local_108.m.m[0][1] = 0.0;
  local_108.m.m[0][2] = 0.0;
  local_108.m.m[0][3] = 0.0;
  local_108.m.m[1][0] = 0.0;
  local_108.m.m[1][1] = 1.0;
  local_108.m.m[1][2] = 0.0;
  local_108.m.m[1][3] = 0.0;
  local_108.m.m[2][0] = 0.0;
  local_108.m.m[2][1] = 0.0;
  local_108.m.m[2][2] = 1.0;
  local_88.m.m[2][2] = 1.0 / (zFar - zNear);
  local_88.mInv.m[2][2] = 1.0 / local_88.m.m[2][2];
  auVar3._8_4_ = 0x3f800000;
  auVar3._0_8_ = 0x3f8000003f800000;
  auVar3._12_4_ = 0x3f800000;
  local_88.m.m[2][3] = 0.0;
  local_88.m.m[3][0] = 0.0;
  local_88.m.m[3][1] = 0.0;
  local_88.m.m[3][2] = 0.0;
  local_88._60_8_ = vmovlps_avx(auVar3);
  auVar2._8_4_ = 0x80000000;
  auVar2._0_8_ = 0x8000000080000000;
  auVar2._12_4_ = 0x80000000;
  auVar1._4_12_ = in_register_00001204;
  auVar1._0_4_ = zNear;
  auVar2 = vxorps_avx512vl(auVar1,auVar2);
  local_88.mInv.m[0][1] = 0.0;
  local_88.mInv.m[0][2] = 0.0;
  local_88.mInv.m[0][3] = 0.0;
  local_88.mInv.m[1][0] = 0.0;
  local_88.mInv.m[1][1] = 1.0;
  local_88.mInv.m[1][2] = 0.0;
  local_88.mInv.m[1][3] = 0.0;
  local_88.mInv.m[2][0] = 0.0;
  local_88.mInv.m[2][1] = 0.0;
  local_88.mInv.m[2][3] = 0.0;
  local_88.mInv.m[3][0] = 0.0;
  local_88.mInv.m[3][1] = 0.0;
  local_88.mInv.m[3][2] = 0.0;
  local_88.mInv.m[3][3] = 1.0;
  local_108.m.m[2][3] = auVar2._0_4_;
  local_108.m.m[3][0] = 0.0;
  local_108.m.m[3][1] = 0.0;
  local_108.m.m[3][2] = 0.0;
  local_108.m.m[3][3] = 1.0;
  local_108.mInv.m[0][0] = 1.0;
  local_108.mInv.m[0][1] = 0.0;
  local_108.mInv.m[0][2] = 0.0;
  local_108.mInv.m[0][3] = -0.0;
  local_108.mInv.m[1][0] = 0.0;
  local_108.mInv.m[1][1] = 1.0;
  local_108.mInv.m[1][2] = 0.0;
  local_108.mInv.m[1][3] = -0.0;
  local_108.mInv.m[2][0] = 0.0;
  local_108.mInv.m[2][1] = 0.0;
  local_108.mInv.m[2][2] = 1.0;
  local_108.mInv.m[3][0] = 0.0;
  local_108.mInv.m[3][1] = 0.0;
  local_108.mInv.m[3][2] = 0.0;
  local_108.mInv.m[3][3] = 1.0;
  local_108.mInv.m[2][3] = zNear;
  Transform::operator*(__return_storage_ptr__,&local_88,&local_108);
  return __return_storage_ptr__;
}

Assistant:

Transform Orthographic(Float zNear, Float zFar) {
    return Scale(1, 1, 1 / (zFar - zNear)) * Translate(Vector3f(0, 0, -zNear));
}